

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::rc::Texture2D::sample4(Texture2D *this,Vec4 *output,Vec2 *packetTexcoords,float lodBias)

{
  int i;
  long lVar1;
  float *pfVar2;
  int fragNdx;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  float local_80;
  float local_7c;
  float local_78 [9];
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  TextureFormat local_40;
  TextureFormat TStack_38;
  
  local_7c = 0.0;
  local_80 = 0.0;
  if (0 < (this->m_view).m_numLevels) {
    local_80 = (float)(((this->m_view).m_levels)->m_size).m_data[0];
    local_7c = (float)(((this->m_view).m_levels)->m_size).m_data[1];
  }
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  lVar1 = 0;
  do {
    local_78[lVar1 + 6] = packetTexcoords[1].m_data[lVar1] - packetTexcoords->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  lVar1 = 0;
  do {
    local_78[lVar1 + 4] = packetTexcoords[3].m_data[lVar1] - packetTexcoords[2].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  lVar1 = 0;
  do {
    local_78[lVar1 + 2] = packetTexcoords[2].m_data[lVar1] - packetTexcoords->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  lVar1 = 0;
  do {
    local_78[lVar1] = packetTexcoords[3].m_data[lVar1] - packetTexcoords[1].m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_48 = local_78[6];
  local_50 = local_78[4];
  local_4c = local_78[2];
  local_54 = local_78[0];
  uVar3 = 0;
  local_44 = lodBias;
  do {
    fVar6 = local_48;
    if (1 < uVar3) {
      fVar6 = local_50;
    }
    pfVar2 = local_78 + 4;
    if (1 >= uVar3) {
      pfVar2 = local_78 + 6;
    }
    bVar4 = (uVar3 & 1) != 0;
    fVar10 = local_4c;
    if (bVar4) {
      fVar10 = local_54;
    }
    fVar7 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar7 = fVar6;
    }
    fVar6 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar6 = fVar10;
    }
    fVar10 = pfVar2[1];
    fVar8 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar8 = fVar10;
    }
    pfVar2 = local_78;
    if (!bVar4) {
      pfVar2 = local_78 + 2;
    }
    fVar10 = pfVar2[1];
    fVar9 = -fVar10;
    if (-fVar10 <= fVar10) {
      fVar9 = fVar10;
    }
    fVar6 = (float)(~-(uint)(fVar6 <= fVar7) & (uint)fVar6 | (uint)fVar7 & -(uint)(fVar6 <= fVar7))
            * local_80;
    fVar10 = (float)(~-(uint)(fVar9 <= fVar8) & (uint)fVar9 | (uint)fVar8 & -(uint)(fVar9 <= fVar8))
             * local_7c;
    uVar5 = -(uint)(fVar10 <= fVar6);
    fVar6 = logf((float)(~uVar5 & (uint)fVar10 | (uint)fVar6 & uVar5));
    tcu::sampleLevelArray2D
              ((ConstPixelBufferAccess *)&local_40,(int)(this->m_view).m_levels,
               (Sampler *)(ulong)(uint)(this->m_view).m_numLevels,packetTexcoords[uVar3].m_data[0],
               packetTexcoords[uVar3].m_data[1],(int)this + 0x18,fVar6 * 1.442695 + local_44);
    *(TextureFormat *)output = local_40;
    *(TextureFormat *)((long)output + 8) = TStack_38;
    uVar3 = uVar3 + 1;
    output = (Vec4 *)((long)output + 0x10);
  } while (uVar3 != 4);
  return;
}

Assistant:

void Texture2D::sample4 (tcu::Vec4 output[4], const tcu::Vec2 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec2 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec2 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec2 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec2 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), lod);
	}
}